

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

uint32_t get_error_code_from_lib_error_code(int lib_error_code)

{
  uint32_t local_c;
  int lib_error_code_local;
  
  switch(lib_error_code) {
  case -0x215:
    local_c = 7;
    break;
  case -0x214:
  case -0x213:
  case -0x1f9:
    local_c = 1;
    break;
  default:
    local_c = 2;
    break;
  case -0x20c:
    local_c = 3;
    break;
  case -0x20b:
    local_c = 9;
    break;
  case -0x20a:
    local_c = 6;
    break;
  case -0x1fe:
    local_c = 5;
  }
  return local_c;
}

Assistant:

static uint32_t get_error_code_from_lib_error_code(int lib_error_code) {
  switch (lib_error_code) {
  case NGHTTP2_ERR_STREAM_CLOSED:
    return NGHTTP2_STREAM_CLOSED;
  case NGHTTP2_ERR_HEADER_COMP:
    return NGHTTP2_COMPRESSION_ERROR;
  case NGHTTP2_ERR_FRAME_SIZE_ERROR:
    return NGHTTP2_FRAME_SIZE_ERROR;
  case NGHTTP2_ERR_FLOW_CONTROL:
    return NGHTTP2_FLOW_CONTROL_ERROR;
  case NGHTTP2_ERR_REFUSED_STREAM:
    return NGHTTP2_REFUSED_STREAM;
  case NGHTTP2_ERR_PROTO:
  case NGHTTP2_ERR_HTTP_HEADER:
  case NGHTTP2_ERR_HTTP_MESSAGING:
    return NGHTTP2_PROTOCOL_ERROR;
  default:
    return NGHTTP2_INTERNAL_ERROR;
  }
}